

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O2

ostream * plot::detail::
          output_vbox_line<std::tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>,std::tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>>
                    (ostream *stream,size_t width,
                    tuple<const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
                    *first,tuple<const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
                           *rest)

{
  block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *pbVar1;
  value_type *line;
  ostream *poVar2;
  
  pbVar1 = (first->
           super__Tuple_impl<0UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
           ).
           super__Tuple_impl<1UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
           .
           super__Head_base<1UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_false>
           ._M_head_impl;
  line = &((first->
           super__Tuple_impl<0UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
           ).
           super__Head_base<0UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_false>
          ._M_head_impl)->line_;
  if (((line->line_).line_.it_._M_current == (pbVar1->line_).line_.line_.it_._M_current) &&
     (line->overflow_ == (pbVar1->line_).overflow_)) {
    poVar2 = output_vbox_line<std::tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>>
                       (stream,width,rest);
    return poVar2;
  }
  poVar2 = operator<<(stream,line);
  *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
       (long)(((int)width -
              (int)(((first->
                     super__Tuple_impl<0UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
                     ).
                     super__Tuple_impl<1UL,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
                     .
                     super__Tuple_impl<2UL,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
                     .
                     super__Head_base<2UL,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&,_false>
                    ._M_head_impl)->block_->canvas_).cols_) + -2);
  poVar2 = std::operator<<(poVar2,"");
  return poVar2;
}

Assistant:

inline std::ostream& output_vbox_line(std::ostream& stream, std::size_t width, Arg&& first, Args&&... rest) {
        return (std::get<0>(std::forward<Arg>(first)) != std::get<1>(std::forward<Arg>(first)))
            ? (stream << *std::get<0>(std::forward<Arg>(first))
                      << std::setw(width - detail::block_traits<std::decay_t<std::tuple_element_t<2, std::decay_t<Arg>>>>
                          ::size(std::get<2>(std::forward<Arg>(first))).x) << u8"")
            : output_vbox_line(stream, width, std::forward<Args>(rest)...);
    }